

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O3

void __thiscall
adios2::utils::Reorganize::
print0<char_const(&)[22],int&,char_const(&)[3],std::__cxx11::string_const&>
          (Reorganize *this,char (*arg) [22],int *args,char (*args_1) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  size_t sVar1;
  
  if (this->m_Rank != 0) {
    return;
  }
  sVar1 = strlen(*arg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,*arg,sVar1);
  std::ostream::operator<<((ostream *)&std::cout,*args);
  sVar1 = strlen(*args_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,*args_1,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(args_2->_M_dataplus)._M_p,args_2->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void Reorganize::print0(Arg &&arg, Args &&...args)
{
    if (!m_Rank)
    {
        std::cout << std::forward<Arg>(arg);
        using expander = int[];
        (void)expander{0, (void(std::cout << std::forward<Args>(args)), 0)...};
        std::cout << std::endl;
    }
}